

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O1

uint * Gia_ManConvertAigToTruth
                 (Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vTruth,
                 Vec_Int_t *vVisited)

{
  undefined4 uVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  void *pvVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  uint *puVar10;
  ulong uVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint (*pauVar19) [8];
  uint nWords;
  
  iVar15 = vLeaves->nSize;
  uVar13 = (ulong)iVar15;
  iVar14 = iVar15 + -5;
  uVar18 = 1 << ((byte)iVar14 & 0x1f);
  nWords = 1;
  if (5 < (long)uVar13) {
    nWords = uVar18;
  }
  if ((~*(ulong *)((ulong)pRoot & 0xfffffffffffffffe) & 0x1fffffff1fffffff) == 0) {
    vTruth->nSize = 0;
    if (0 < (int)nWords) {
      vTruth->nSize = nWords;
      if (vTruth->nCap < (int)nWords) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = vTruth->pArray;
      }
      if (((ulong)pRoot & 1) == 0) {
        iVar15 = 0;
      }
      else {
        iVar15 = 0xff;
      }
      puVar10 = (uint *)memset(piVar6,iVar15,(ulong)nWords << 2);
      return puVar10;
    }
LAB_0070ad39:
    __assert_fail("nWords > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
  }
  if (iVar15 < 9) {
    piVar6 = (int *)0x0;
  }
  else {
    pvVar4 = malloc(((long)(int)uVar18 * 4 + 8) * uVar13);
    lVar5 = uVar13 * 8;
    uVar11 = 0;
    do {
      *(long *)((long)pvVar4 + uVar11 * 8) = (long)pvVar4 + lVar5;
      uVar11 = uVar11 + 1;
      lVar5 = lVar5 + (long)(int)uVar18 * 4;
    } while (uVar13 != uVar11);
    piVar6 = (int *)malloc(0x10);
    piVar6[1] = iVar15;
    *piVar6 = iVar15;
    *(void **)(piVar6 + 2) = pvVar4;
    if ((int)uVar18 < 2) {
      uVar18 = 1;
    }
    uVar11 = 0;
    do {
      lVar5 = *(long *)((long)pvVar4 + uVar11 * 8);
      if (uVar11 < 5) {
        if (iVar14 != 0x1f) {
          uVar1 = (&DAT_00a35ff0)[uVar11];
          uVar16 = 0;
          do {
            *(undefined4 *)(lVar5 + uVar16 * 4) = uVar1;
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
      }
      else if (iVar14 != 0x1f) {
        uVar16 = 0;
        do {
          *(uint *)(lVar5 + uVar16 * 4) =
               -(uint)((1 << ((char)uVar11 - 5U & 0x1f) & (uint)uVar16) != 0);
          uVar16 = uVar16 + 1;
        } while (uVar18 != uVar16);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar13);
  }
  vTruth->nSize = 0;
  vVisited->nSize = 0;
  uVar13 = (ulong)nWords;
  if (0 < vLeaves->nSize) {
    pauVar19 = Gia_ManConvertAigToTruth::uTruths;
    lVar5 = 0;
    do {
      iVar15 = vLeaves->pArray[lVar5];
      lVar17 = (long)iVar15;
      if ((lVar17 < 0) || (p->nObjs <= iVar15)) goto LAB_0070acdc;
      pGVar9 = p->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      if ((int)nWords < 1) goto LAB_0070ad39;
      lVar7 = (long)vTruth->nSize + (long)(int)nWords;
      iVar14 = (int)lVar7;
      vTruth->nSize = iVar14;
      if (vTruth->nCap < iVar14) {
        piVar8 = (int *)0x0;
      }
      else {
        piVar8 = vTruth->pArray + (lVar7 - uVar13);
      }
      uVar11 = uVar13 + 1;
      if (piVar6 == (int *)0x0) {
        do {
          uVar16 = (ulong)pauVar19[-1][uVar11 + 6];
          piVar8[uVar11 - 2] = pauVar19[-1][uVar11 + 6];
          uVar11 = uVar11 - 1;
        } while (1 < (long)uVar11);
      }
      else {
        if (piVar6[1] <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar7 = *(long *)(*(long *)(piVar6 + 2) + lVar5 * 8);
        uVar16 = uVar13 + 1;
        do {
          piVar8[uVar16 - 2] = *(int *)(lVar7 + -8 + uVar16 * 4);
          uVar16 = uVar16 - 1;
        } while (1 < (long)uVar16);
      }
      if (p->nObjs <= iVar15) {
LAB_0070acfb:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pVVar2 = p->vTruths;
      iVar14 = vVisited->nSize;
      Vec_IntFillExtra(pVVar2,iVar15 + 1,(int)uVar16);
      if (pVVar2->nSize <= iVar15) goto LAB_0070ad1a;
      pGVar9 = pGVar9 + lVar17;
      pVVar2->pArray[lVar17] = iVar14;
      pGVar3 = p->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) goto LAB_0070acfb;
      Vec_IntPush(vVisited,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      lVar5 = lVar5 + 1;
      pauVar19 = pauVar19 + 1;
    } while (lVar5 < vLeaves->nSize);
  }
  if (piVar6 != (int *)0x0) {
    if (*(void **)(piVar6 + 2) != (void *)0x0) {
      free(*(void **)(piVar6 + 2));
      piVar6[2] = 0;
      piVar6[3] = 0;
    }
    free(piVar6);
  }
  puVar10 = Gia_ManConvertAigToTruth_rec
                      (p,(Gia_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe),vTruth,nWords,vVisited);
  if ((0 < (int)nWords & (byte)pRoot) == 1) {
    lVar5 = uVar13 + 1;
    do {
      puVar10[lVar5 + -2] = ~puVar10[lVar5 + -2];
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  if (0 < vVisited->nSize) {
    lVar5 = 0;
    uVar12 = extraout_RDX;
    do {
      iVar15 = vVisited->pArray[lVar5];
      if (((long)iVar15 < 0) || (p->nObjs <= iVar15)) {
LAB_0070acdc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return puVar10;
      }
      pVVar2 = p->vTruths;
      Vec_IntFillExtra(pVVar2,iVar15 + 1,(int)uVar12);
      if (pVVar2->nSize <= iVar15) {
LAB_0070ad1a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar2->pArray[iVar15] = -1;
      lVar5 = lVar5 + 1;
      uVar12 = extraout_RDX_00;
    } while (lVar5 < vVisited->nSize);
  }
  return puVar10;
}

Assistant:

unsigned * Gia_ManConvertAigToTruth( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vTruth, Vec_Int_t * vVisited )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Gia_Obj_t * pObj;
    Vec_Ptr_t * vTtElems = NULL;
    unsigned * pTruth;//, * pTruth2;
    int i, nWords, nVars;
    // get the number of variables and words
    nVars  = Vec_IntSize( vLeaves );
    nWords = Abc_TruthWordNum( nVars );
    // check the case of a constant
    if ( Gia_ObjIsConst0( Gia_Regular(pRoot) ) )
    {
        Vec_IntClear( vTruth );
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        if ( !Gia_IsComplement(pRoot) )
            Gia_ManTruthClear( pTruth, nVars );
        else
            Gia_ManTruthFill( pTruth, nVars );
        return pTruth;
    }
    // if the number of variables is more than 8, allocate truth tables
    if ( nVars > 8 )
        vTtElems = Vec_PtrAllocTruthTables( nVars );
    // assign elementary truth tables
    Vec_IntClear( vTruth );
    Vec_IntClear( vVisited );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        // assign elementary variable
        if ( vTtElems )
            Gia_ManTruthCopy( pTruth, (unsigned *)Vec_PtrEntry(vTtElems, i), nVars );
        else
            Gia_ManTruthCopy( pTruth, uTruths[i], nVars );
        // save the visited node
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), Vec_IntSize(vVisited) );
        Vec_IntPush( vVisited, Gia_ObjId(p, pObj) );
    }
    if ( vTtElems )
        Vec_PtrFree( vTtElems );
    // clear the marks and compute the truth table
//    pTruth2 = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    pTruth = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    // copy the result
//    Gia_ManTruthCopy( pTruth, pTruth2, nVars );
    if ( Gia_IsComplement(pRoot) )
        Gia_ManTruthNot( pTruth, pTruth, nVars );
    // clean truth tables
    Gia_ManForEachObjVec( vVisited, p, pObj, i )
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), -1 );
    return pTruth;
}